

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void divide_subset_split<float,int>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double split_point,MissingAction missing_action,size_t *st_NA,
               size_t *end_NA,size_t *split_ix)

{
  ulong *puVar1;
  ulong *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  unsigned_long *puVar7;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  ulong *puVar11;
  int iVar12;
  size_t *psVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  size_t *r;
  ulong uVar17;
  ulong uVar18;
  
  uVar15 = (ulong)Xc_indptr[col_num];
  uVar17 = (ulong)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    sVar16 = end + 1;
    if (split_point < 0.0) {
      sVar16 = st;
    }
    psVar13 = split_ix;
    if (missing_action != Fail) {
      *st_NA = sVar16;
      psVar13 = end_NA;
    }
    *psVar13 = sVar16;
  }
  uVar14 = (ulong)Xc_ind[uVar17 - 1];
  puVar2 = ix_arr + end + 1;
  puVar7 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar2,Xc_ind + uVar15);
  piVar8 = Xc_ind + uVar17;
  uVar18 = uVar17 - 1;
  sVar16 = (long)puVar7 - (long)ix_arr >> 3;
  if (puVar7 <= ix_arr + st) {
    sVar16 = st;
  }
  if (split_point < 0.0) {
    sVar16 = st;
  }
  puVar1 = ix_arr + end;
  if (missing_action == Fail) {
    if (split_point < 0.0) {
      do {
        piVar9 = Xc_ind + uVar15;
        while( true ) {
          if (((puVar7 == puVar2) || (uVar15 == uVar17)) || (uVar10 = *puVar7, uVar14 < uVar10))
          goto LAB_002430a6;
          if (*piVar9 == (int)uVar10) {
            if ((double)Xc[uVar15] <= split_point) {
              uVar4 = ix_arr[st];
              ix_arr[st] = uVar10;
              *puVar7 = uVar4;
              st = st + 1;
            }
            if ((puVar7 == puVar1) || (uVar15 == uVar18)) goto LAB_002430a6;
            puVar7 = puVar7 + 1;
            piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (piVar9 + 1,piVar8,puVar7);
            goto LAB_00243172;
          }
          if (*piVar9 <= (int)uVar10) break;
          puVar7 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar7 + 1,puVar2,piVar9);
        }
        piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (piVar9 + 1,piVar8,puVar7);
LAB_00243172:
        uVar15 = (long)piVar9 - (long)Xc_ind >> 2;
      } while( true );
    }
LAB_00242dbd:
    st = sVar16;
    if (puVar7 != puVar2) {
      if (uVar17 <= uVar15) goto LAB_00242ec1;
      iVar3 = Xc_ind[uVar15];
      iVar12 = (int)*puVar7;
      if (iVar3 == iVar12) {
        if ((double)Xc[uVar15] <= split_point) {
          uVar14 = ix_arr[sVar16];
          ix_arr[sVar16] = *puVar7;
          *puVar7 = uVar14;
          sVar16 = sVar16 + 1;
        }
        if ((uVar15 == uVar18) && (puVar11 = puVar7, puVar7 < puVar1)) {
          while (puVar11 = puVar11 + 1, puVar11 <= puVar1) {
            uVar14 = ix_arr[sVar16];
            ix_arr[sVar16] = *puVar11;
            *puVar11 = uVar14;
            sVar16 = sVar16 + 1;
          }
        }
        st = sVar16;
        if ((uVar15 == uVar18) || (puVar7 == puVar1)) goto LAB_002430a6;
        puVar7 = puVar7 + 1;
        piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (Xc_ind + uVar15 + 1,piVar8,puVar7);
      }
      else {
        if (iVar12 < iVar3) {
          for (; (puVar7 <= puVar1 && ((int)*puVar7 < iVar3)); puVar7 = puVar7 + 1) {
            uVar14 = ix_arr[sVar16];
            ix_arr[sVar16] = *puVar7;
            *puVar7 = uVar14;
            sVar16 = sVar16 + 1;
          }
          goto LAB_00242dbd;
        }
        piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (Xc_ind + uVar15 + 1,piVar8,puVar7);
      }
      uVar15 = (long)piVar9 - (long)Xc_ind >> 2;
      goto LAB_00242dbd;
    }
    goto LAB_002430a6;
  }
  if (split_point < 0.0) {
    bVar6 = false;
    uVar10 = uVar15;
    do {
      piVar9 = Xc_ind + uVar10;
      while( true ) {
        if (((puVar7 == puVar2) || (uVar10 == uVar17)) || (uVar4 = *puVar7, uVar14 < uVar4))
        goto LAB_00242fb6;
        if (*piVar9 == (int)uVar4) {
          if (NAN(Xc[uVar10])) {
            bVar6 = true;
          }
          else if ((double)Xc[uVar10] <= split_point) {
            uVar5 = ix_arr[st];
            ix_arr[st] = uVar4;
            *puVar7 = uVar5;
            st = st + 1;
          }
          if ((puVar7 == puVar1) || (uVar10 == uVar18)) goto LAB_00242fb6;
          puVar7 = puVar7 + 1;
          piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (piVar9 + 1,piVar8,puVar7);
          goto LAB_00242f93;
        }
        if (*piVar9 <= (int)uVar4) break;
        puVar7 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar7 + 1,puVar2,piVar9);
      }
      piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (piVar9 + 1,piVar8,puVar7);
LAB_00242f93:
      uVar10 = (long)piVar9 - (long)Xc_ind >> 2;
    } while( true );
  }
  bVar6 = false;
  uVar10 = uVar15;
  st = sVar16;
LAB_00242c7d:
  if (puVar7 != puVar2) {
    if (uVar17 <= uVar10) goto LAB_00242d92;
    iVar3 = Xc_ind[uVar10];
    iVar12 = (int)*puVar7;
    if (iVar3 == iVar12) {
      if (NAN(Xc[uVar10])) {
        bVar6 = true;
      }
      else if ((double)Xc[uVar10] <= split_point) {
        uVar4 = ix_arr[st];
        ix_arr[st] = *puVar7;
        *puVar7 = uVar4;
        st = st + 1;
      }
      if ((uVar10 == uVar18) && (puVar11 = puVar7, puVar7 < puVar1)) {
        while (puVar11 = puVar11 + 1, puVar11 <= puVar1) {
          uVar4 = ix_arr[st];
          ix_arr[st] = *puVar11;
          *puVar11 = uVar4;
          st = st + 1;
        }
      }
      if ((uVar10 == uVar18) || (puVar7 == puVar1)) goto LAB_00242fb6;
      puVar7 = puVar7 + 1;
      piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (Xc_ind + uVar10 + 1,piVar8,puVar7);
    }
    else {
      if (iVar12 < iVar3) {
        for (; (puVar7 <= puVar1 && ((int)*puVar7 < iVar3)); puVar7 = puVar7 + 1) {
          uVar4 = ix_arr[st];
          ix_arr[st] = *puVar7;
          *puVar7 = uVar4;
          st = st + 1;
        }
        goto LAB_00242c7d;
      }
      piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (Xc_ind + uVar10 + 1,piVar8,puVar7);
    }
    uVar10 = (long)piVar9 - (long)Xc_ind >> 2;
    goto LAB_00242c7d;
  }
LAB_00242fb6:
  *st_NA = st;
  split_ix = end_NA;
  if (bVar6) {
    puVar11 = ix_arr + st;
    std::__sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(puVar11);
    do {
      piVar9 = Xc_ind + uVar15;
      while( true ) {
        if (((puVar11 == puVar2) || (uVar15 == uVar17)) || (uVar10 = *puVar11, uVar14 < uVar10))
        goto LAB_002430a6;
        if (*piVar9 == (int)uVar10) {
          if (NAN(Xc[uVar15])) {
            uVar4 = ix_arr[st];
            ix_arr[st] = uVar10;
            *puVar11 = uVar4;
            st = st + 1;
          }
          if ((puVar11 == puVar1) || (uVar15 == uVar18)) goto LAB_002430a6;
          puVar11 = puVar11 + 1;
          piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (piVar9 + 1,piVar8,puVar11);
          goto LAB_00243074;
        }
        if (*piVar9 <= (int)uVar10) break;
        puVar11 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                            (puVar11 + 1,puVar2,piVar9);
      }
      piVar9 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (piVar9 + 1,piVar8,puVar11);
LAB_00243074:
      uVar15 = (long)piVar9 - (long)Xc_ind >> 2;
    } while( true );
  }
LAB_002430a6:
  *split_ix = st;
  return;
LAB_00242ec1:
  for (; st = sVar16, puVar7 <= puVar1; puVar7 = puVar7 + 1) {
    uVar15 = ix_arr[sVar16];
    ix_arr[sVar16] = *puVar7;
    *puVar7 = uVar15;
    sVar16 = sVar16 + 1;
  }
  goto LAB_002430a6;
LAB_00242d92:
  for (; puVar7 <= puVar1; puVar7 = puVar7 + 1) {
    uVar10 = ix_arr[st];
    ix_arr[st] = *puVar7;
    *puVar7 = uVar10;
    st = st + 1;
  }
  goto LAB_00242fb6;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                         real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    /* TODO: this is a mess, needs refactoring */
    /* TODO: when moving zeros, would be better to instead move by '>' (opposite as in here) */
    /* TODO: should create an extra version to go along with 'predict' that would
       add the range penalty right here to spare operations. */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        if (missing_action == Fail)
        {
            split_ix = (0 <= split_point)? (end+1) : st;
        }

        else
        {
            st_NA  = (0 <= split_point)? (end+1) : st;
            end_NA = (0 <= split_point)? (end+1) : st;
        }

    }

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t temp;
    bool   move_zeros = 0 <= split_point;
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    if (move_zeros && ptr_st > ix_arr + st)
        st = ptr_st - ix_arr;

    if (missing_action == Fail)
    {
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                    {
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        split_ix = st;
    }

    else /* can have NAs */
    {

        bool has_NAs = false;
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                        has_NAs = true;
                    else if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                    {
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                    }
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos]))) has_NAs = true;
                    if (!std::isnan(Xc[curr_pos]) && Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }


        st_NA = st;
        if (has_NAs)
        {
            curr_pos = st_col;
            std::sort(ix_arr + st, ix_arr + end + 1);
            for (size_t *row = ix_arr + st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }
        end_NA = st;

    }

}